

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall
mkvparser::Track::GetNext(Track *this,BlockEntry *pCurrEntry,BlockEntry **pNextEntry)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  BlockEntry *pBVar3;
  undefined4 extraout_var_00;
  Cluster *this_00;
  bool bVar4;
  
  if (pCurrEntry == (BlockEntry *)0x0) {
    __assert_fail("pCurrEntry",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1275,
                  "long mkvparser::Track::GetNext(const BlockEntry *, const BlockEntry *&) const");
  }
  iVar1 = (*pCurrEntry->_vptr_BlockEntry[3])(pCurrEntry);
  if (iVar1 == 0) {
    __assert_fail("!pCurrEntry->EOS()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1276,
                  "long mkvparser::Track::GetNext(const BlockEntry *, const BlockEntry *&) const");
  }
  iVar1 = (*pCurrEntry->_vptr_BlockEntry[2])(pCurrEntry);
  if ((CONCAT44(extraout_var,iVar1) == 0) ||
     (*(long *)(CONCAT44(extraout_var,iVar1) + 0x10) != (this->m_info).number)) {
    __assert_fail("pCurrBlock && pCurrBlock->GetTrackNumber() == m_info.number",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1279,
                  "long mkvparser::Track::GetNext(const BlockEntry *, const BlockEntry *&) const");
  }
  this_00 = pCurrEntry->m_pCluster;
  if (this_00 == (Cluster *)0x0) {
    __assert_fail("pCluster",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x127e,
                  "long mkvparser::Track::GetNext(const BlockEntry *, const BlockEntry *&) const");
  }
  if (this_00->m_pSegment == (Segment *)0x0) {
    __assert_fail("!pCluster->EOS()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x127f,
                  "long mkvparser::Track::GetNext(const BlockEntry *, const BlockEntry *&) const");
  }
  pBVar3 = (BlockEntry *)Cluster::GetNext(this_00,pCurrEntry,pNextEntry);
  if (-1 < (long)pBVar3) {
    iVar1 = 0;
LAB_0012c40a:
    do {
      if (*pNextEntry == (BlockEntry *)0x0) {
        this_00 = Segment::GetNext(this->m_pSegment,this_00);
        if (this_00 == (Cluster *)0x0) {
          pBVar3 = &(this->m_eos).super_BlockEntry;
          pCurrEntry = (BlockEntry *)0x1;
        }
        else {
          if (this_00->m_pSegment != (Segment *)0x0) {
            pBVar3 = (BlockEntry *)Cluster::GetFirst(this_00,pNextEntry);
            if ((long)pBVar3 < 0) {
              bVar4 = false;
              goto LAB_0012c4c7;
            }
            if ((*pNextEntry != (BlockEntry *)0x0) && (iVar1 = iVar1 + 1, iVar1 == 100)) {
              bVar4 = true;
              pBVar3 = pCurrEntry;
              goto LAB_0012c4c7;
            }
            goto LAB_0012c40a;
          }
          bVar4 = Segment::DoneParsing(this->m_pSegment);
          pBVar3 = (BlockEntry *)0x0;
          if (bVar4) {
            pBVar3 = &(this->m_eos).super_BlockEntry;
          }
          pCurrEntry = (BlockEntry *)((ulong)bVar4 * 4 + -3);
        }
        *pNextEntry = pBVar3;
        break;
      }
      iVar2 = (*(*pNextEntry)->_vptr_BlockEntry[2])();
      if (CONCAT44(extraout_var_00,iVar2) == 0) {
        __assert_fail("pNextBlock",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1289,
                      "long mkvparser::Track::GetNext(const BlockEntry *, const BlockEntry *&) const"
                     );
      }
      if (*(long *)(CONCAT44(extraout_var_00,iVar2) + 0x10) == (this->m_info).number) {
        bVar4 = false;
        pCurrEntry = (BlockEntry *)0x0;
      }
      else {
        pBVar3 = (BlockEntry *)Cluster::GetNext(this_00,*pNextEntry,pNextEntry);
        bVar4 = -1 < (long)pBVar3;
        if (!bVar4) {
          pCurrEntry = pBVar3;
        }
      }
    } while (bVar4);
    bVar4 = false;
    pBVar3 = pCurrEntry;
LAB_0012c4c7:
    if (bVar4) {
      *pNextEntry = &(this->m_eos).super_BlockEntry;
      pBVar3 = (BlockEntry *)0x1;
    }
  }
  return (long)pBVar3;
}

Assistant:

long Track::GetNext(const BlockEntry* pCurrEntry,
                    const BlockEntry*& pNextEntry) const {
  assert(pCurrEntry);
  assert(!pCurrEntry->EOS());  //?

  const Block* const pCurrBlock = pCurrEntry->GetBlock();
  assert(pCurrBlock && pCurrBlock->GetTrackNumber() == m_info.number);
  if (!pCurrBlock || pCurrBlock->GetTrackNumber() != m_info.number)
    return -1;

  const Cluster* pCluster = pCurrEntry->GetCluster();
  assert(pCluster);
  assert(!pCluster->EOS());

  long status = pCluster->GetNext(pCurrEntry, pNextEntry);

  if (status < 0)  // error
    return status;

  for (int i = 0;;) {
    while (pNextEntry) {
      const Block* const pNextBlock = pNextEntry->GetBlock();
      assert(pNextBlock);

      if (pNextBlock->GetTrackNumber() == m_info.number)
        return 0;

      pCurrEntry = pNextEntry;

      status = pCluster->GetNext(pCurrEntry, pNextEntry);

      if (status < 0)  // error
        return status;
    }

    pCluster = m_pSegment->GetNext(pCluster);

    if (pCluster == NULL) {
      pNextEntry = GetEOS();
      return 1;
    }

    if (pCluster->EOS()) {
      if (m_pSegment->DoneParsing()) {
        pNextEntry = GetEOS();
        return 1;
      }

      // TODO: there is a potential O(n^2) problem here: we tell the
      // caller to (pre)load another cluster, which he does, but then he
      // calls GetNext again, which repeats the same search.  This is
      // a pathological case, since the only way it can happen is if
      // there exists a long sequence of clusters none of which contain a
      // block from this track.  One way around this problem is for the
      // caller to be smarter when he loads another cluster: don't call
      // us back until you have a cluster that contains a block from this
      // track. (Of course, that's not cheap either, since our caller
      // would have to scan the each cluster as it's loaded, so that
      // would just push back the problem.)

      pNextEntry = NULL;
      return E_BUFFER_NOT_FULL;
    }

    status = pCluster->GetFirst(pNextEntry);

    if (status < 0)  // error
      return status;

    if (pNextEntry == NULL)  // empty cluster
      continue;

    ++i;

    if (i >= 100)
      break;
  }

  // NOTE: if we get here, it means that we didn't find a block with
  // a matching track number after lots of searching, so we give
  // up trying.

  pNextEntry = GetEOS();  // so we can return a non-NULL value
  return 1;
}